

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
::remove<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  Comparison CVar4;
  ulong uVar5;
  Node *pNVar6;
  uint uVar7;
  ulong uVar8;
  Node *pNVar9;
  bool bVar10;
  Top local_38;
  
  local_38._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_38._inner._inner._content[7] = key._inner._inner._content[7];
  pNVar9 = this->_left;
  uVar5 = (ulong)this->_top;
LAB_002c16a6:
  uVar7 = (int)uVar5 - 1;
  uVar5 = (ulong)uVar7;
  pNVar1 = pNVar9;
  do {
    pNVar9 = pNVar1;
    while( true ) {
      pNVar1 = pNVar9->nodes[uVar7];
      if ((pNVar1 == (Node *)0x0) ||
         (CVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
                  SListIntermediateNode::NodePtrComparator::compare(&local_38,pNVar1->value),
         CVar4 == LESS)) goto LAB_002c16a6;
      if (CVar4 == GREATER) break;
      if (CVar4 == EQUAL) {
        pNVar6 = pNVar1;
        if (uVar7 == 0) {
          uVar5 = 0;
          uVar8 = uVar5;
        }
        else {
          pNVar2 = pNVar1->nodes[0];
          uVar8 = uVar5;
          if (((pNVar2 != (Node *)0x0) && (pNVar1->nodes[uVar7] != pNVar2)) &&
             (CVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
                      SListIntermediateNode::NodePtrComparator::compare(&local_38,pNVar2->value),
             CVar4 == EQUAL)) {
            pNVar6 = pNVar1->nodes[0];
            uVar5 = 0xffffffffffffffff;
            do {
              iVar3 = (int)uVar5;
              uVar5 = (ulong)(iVar3 + 1);
              pNVar9 = pNVar1;
              uVar8 = uVar5;
            } while (pNVar6 == pNVar1->nodes[iVar3 + 2]);
          }
        }
        while( true ) {
          pNVar9->nodes[uVar5] = pNVar6->nodes[uVar5];
          bVar10 = uVar5 == 0;
          uVar5 = uVar5 - 1;
          if (bVar10) break;
          pNVar1 = pNVar9;
          do {
            pNVar9 = pNVar1;
            pNVar1 = pNVar9->nodes[uVar5 & 0xffffffff];
          } while (pNVar9->nodes[uVar5 & 0xffffffff] != pNVar6);
        }
        deallocate(pNVar6,(uint)uVar8);
        return;
      }
    }
  } while( true );
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }